

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

tm * http_gmtime(time_t timer,tm *tm)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  ushort uVar5;
  byte bVar6;
  ushort uVar7;
  uint uVar8;
  long lVar9;
  char cVar10;
  bool local_a1;
  bool local_89;
  long local_88;
  uint8_t is_leap;
  uint8_t m;
  uint16_t d;
  uint16_t mp;
  uint16_t doy;
  uint16_t yoe;
  uint32_t doe;
  size_t era;
  long local_28;
  ssize_t b;
  ssize_t a;
  tm *tm_local;
  time_t timer_local;
  
  a = (ssize_t)tm;
  tm_local = (tm *)timer;
  memset(&era,0,0x38);
  memcpy(tm,&era,0x38);
  if ((long)tm_local < 0) {
    local_28 = (long)tm_local / 0x3c;
    if (local_28 * 0x3c - (long)tm_local == 0) {
      *(undefined4 *)a = 0;
    }
    else {
      *(int *)a = (int)tm_local + (int)local_28 * -0x3c + 0x3c;
      local_28 = local_28 + -1;
    }
    b = local_28 / 0x3c;
    if (b * 0x3c - local_28 == 0) {
      *(undefined4 *)(a + 4) = 0;
    }
    else {
      *(int *)(a + 4) = (int)local_28 + (int)b * -0x3c + 0x3c;
      b = b + -1;
    }
    local_28 = b / 0x18;
    if (local_28 * 0x18 - b == 0) {
      *(undefined4 *)(a + 8) = 0;
    }
    else {
      *(int *)(a + 8) = (int)b + (int)local_28 * -0x18 + 0x18;
      local_28 = local_28 + -1;
    }
    *(int *)(a + 0x18) = (int)((local_28 + -3) % 7);
    if (*(int *)(a + 0x18) != 0) {
      *(int *)(a + 0x18) = *(int *)(a + 0x18) + 7;
    }
  }
  else {
    iVar3 = (int)((long)tm_local / 0x3c);
    *(int *)a = (int)tm_local + iVar3 * -0x3c;
    local_28 = ((long)tm_local / 0x3c) / 0x3c;
    iVar4 = (int)local_28;
    *(int *)(a + 4) = iVar3 + iVar4 * -0x3c;
    local_28 = local_28 / 0x18;
    *(int *)(a + 8) = iVar4 + (int)local_28 * -0x18;
    *(int *)(a + 0x18) = (int)((local_28 + 4) % 7);
  }
  lVar9 = local_28 + 0xafa6c;
  local_88 = lVar9;
  if (lVar9 < 0) {
    local_88 = local_28 + 0x8bfbc;
  }
  uVar8 = (int)lVar9 + (int)(local_88 / 0x23ab1) * -0x23ab1;
  uVar1 = (ulong)(((uVar8 - uVar8 / 0x5b4) + uVar8 / 0x8eac) - uVar8 / 0x23ab0) / 0x16d;
  uVar5 = (ushort)uVar1;
  uVar7 = (short)uVar8 - ((uVar5 * 0x16d + uVar5 / 4) - uVar5 / 100);
  uVar2 = (ulong)((uint)uVar7 * 5 + 2) / 0x99;
  uVar5 = (ushort)uVar2;
  cVar10 = -10;
  if (uVar5 < 10) {
    cVar10 = '\x02';
  }
  bVar6 = (char)uVar2 + cVar10;
  lVar9 = (long)(int)(uint)(bVar6 < 2) + (local_88 / 0x23ab1) * 400 + (uVar1 & 0xffff);
  *(int *)(a + 0x14) = (int)lVar9 + -0x76c;
  *(uint *)(a + 0x10) = (uint)bVar6;
  *(uint *)(a + 0xc) = (uint)(ushort)((uVar7 - (short)(((uint)uVar5 * 0x99 + 2) / 5)) + 1);
  local_89 = false;
  if (lVar9 % 4 == 0) {
    local_a1 = lVar9 % 100 != 0 || lVar9 % 400 == 0;
    local_89 = local_a1;
  }
  *(int *)(a + 0x1c) =
       (int)((ulong)((uint)uVar7 + (uint)local_89 + 0x3b) % (ulong)(long)(int)(local_89 + 0x16d));
  return (tm *)a;
}

Assistant:

struct tm *http_gmtime(time_t timer, struct tm *tm) {
  ssize_t a, b;
#if HAVE_TM_TM_ZONE || defined(BSD)
  *tm = (struct tm){
      .tm_isdst = 0,
      .tm_zone = (char *)"UTC",
  };
#else
  *tm = (struct tm){
      .tm_isdst = 0,
  };
#endif

  // convert seconds from epoch to days from epoch + extract data
  if (timer >= 0) {
    // for seconds up to weekdays, we reduce the reminder every step.
    a = (ssize_t)timer;
    b = a / 60; // b == time in minutes
    tm->tm_sec = a - (b * 60);
    a = b / 60; // b == time in hours
    tm->tm_min = b - (a * 60);
    b = a / 24; // b == time in days since epoch
    tm->tm_hour = a - (b * 24);
    // b == number of days since epoch
    // day of epoch was a thursday. Add + 4 so sunday == 0...
    tm->tm_wday = (b + 4) % 7;
  } else {
    // for seconds up to weekdays, we reduce the reminder every step.
    a = (ssize_t)timer;
    b = a / 60; // b == time in minutes
    if (b * 60 != a) {
      /* seconds passed */
      tm->tm_sec = (a - (b * 60)) + 60;
      --b;
    } else {
      /* no seconds */
      tm->tm_sec = 0;
    }
    a = b / 60; // b == time in hours
    if (a * 60 != b) {
      /* minutes passed */
      tm->tm_min = (b - (a * 60)) + 60;
      --a;
    } else {
      /* no minutes */
      tm->tm_min = 0;
    }
    b = a / 24; // b == time in days since epoch?
    if (b * 24 != a) {
      /* hours passed */
      tm->tm_hour = (a - (b * 24)) + 24;
      --b;
    } else {
      /* no hours */
      tm->tm_hour = 0;
    }
    // day of epoch was a thursday. Add + 4 so sunday == 0...
    tm->tm_wday = ((b - 3) % 7);
    if (tm->tm_wday)
      tm->tm_wday += 7;
    /* b == days from epoch */
  }

  // at this point we can apply the algorithm described here:
  // http://howardhinnant.github.io/date_algorithms.html#civil_from_days
  // Credit to Howard Hinnant.
  {
    b += 719468L; // adjust to March 1st, 2000 (post leap of 400 year era)
    // 146,097 = days in era (400 years)
    const size_t era = (b >= 0 ? b : b - 146096) / 146097;
    const uint32_t doe = (b - (era * 146097)); // day of era
    const uint16_t yoe =
        (doe - doe / 1460 + doe / 36524 - doe / 146096) / 365; // year of era
    a = yoe;
    a += era * 400; // a == year number, assuming year starts on March 1st...
    const uint16_t doy = doe - (365 * yoe + yoe / 4 - yoe / 100);
    const uint16_t mp = (5U * doy + 2) / 153;
    const uint16_t d = doy - (153U * mp + 2) / 5 + 1;
    const uint8_t m = mp + (mp < 10 ? 2 : -10);
    a += (m <= 1);
    tm->tm_year = a - 1900; // tm_year == years since 1900
    tm->tm_mon = m;
    tm->tm_mday = d;
    const uint8_t is_leap = (a % 4 == 0 && (a % 100 != 0 || a % 400 == 0));
    tm->tm_yday = (doy + (is_leap) + 28 + 31) % (365 + is_leap);
  }

  return tm;
}